

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_catalog.cpp
# Opt level: O2

string * __thiscall
duckdb::DuckCatalog::GetDBPath_abi_cxx11_(string *__return_storage_ptr__,DuckCatalog *this)

{
  StorageManager *pSVar1;
  
  pSVar1 = AttachedDatabase::GetStorageManager((this->super_Catalog).db);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pSVar1->path);
  return __return_storage_ptr__;
}

Assistant:

string DuckCatalog::GetDBPath() {
	return db.GetStorageManager().GetDBPath();
}